

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O2

void __thiscall
wasm::OptimizeInstructions::visitGlobalSet(OptimizeInstructions *this,GlobalSet *curr)

{
  if ((((curr->super_SpecificExpression<(wasm::Expression::Id)11>).super_Expression.type.id != 1) &&
      (curr->value->_id == GlobalGetId)) &&
     ((char *)curr->value[1].type.id == (curr->name).super_IString.str._M_str)) {
    (curr->super_SpecificExpression<(wasm::Expression::Id)11>).super_Expression._id = NopId;
    (curr->super_SpecificExpression<(wasm::Expression::Id)11>).super_Expression.type.id = 0;
    replaceCurrent(this,(Expression *)curr);
    return;
  }
  return;
}

Assistant:

void visitGlobalSet(GlobalSet* curr) {
    if (curr->type == Type::unreachable) {
      return;
    }
    // optimize out a set of a get
    auto* get = curr->value->dynCast<GlobalGet>();
    if (get && get->name == curr->name) {
      ExpressionManipulator::nop(curr);
      return replaceCurrent(curr);
    }
  }